

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

void btreeblk_free(btreeblk_handle *handle)

{
  list_elem *plVar1;
  list_elem *plVar2;
  list_elem *plVar3;
  long lVar4;
  ulong uVar5;
  
  plVar3 = (handle->alc_list).head;
  if (plVar3 != (list_elem *)0x0) {
    do {
      plVar2 = list_remove(&handle->alc_list,plVar3);
      plVar1 = plVar3[2].next;
      if (plVar1 != (list_elem *)0x0) {
        plVar1->prev = plVar3[-1].next;
        list_push_front(&handle->blockpool,(list_elem *)&plVar1->next);
      }
      free(plVar3 + -2);
      plVar3 = plVar2;
    } while (plVar2 != (list_elem *)0x0);
  }
  plVar3 = (handle->read_list).head;
  if (plVar3 != (list_elem *)0x0) {
    do {
      plVar2 = list_remove(&handle->read_list,plVar3);
      plVar1 = plVar3[2].next;
      if (plVar1 != (list_elem *)0x0) {
        plVar1->prev = plVar3[-1].next;
        list_push_front(&handle->blockpool,(list_elem *)&plVar1->next);
      }
      free(plVar3 + -2);
      plVar3 = plVar2;
    } while (plVar2 != (list_elem *)0x0);
  }
  plVar3 = (handle->blockpool).head;
  while (plVar3 != (list_elem *)0x0) {
    plVar1 = plVar3 + -1;
    plVar2 = plVar3 + -1;
    plVar3 = plVar3->next;
    free(plVar2->next);
    free(&plVar1->next);
  }
  if (handle->nsb != 0) {
    lVar4 = 0x10;
    uVar5 = 0;
    do {
      free(*(void **)((long)&handle->sb->bid + lVar4));
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < handle->nsb);
  }
  free(handle->sb);
  return;
}

Assistant:

void btreeblk_free(struct btreeblk_handle *handle)
{
    struct list_elem *e;
    struct btreeblk_block *block;

    // free all blocks in alc list
    e = list_begin(&handle->alc_list);
    while(e) {
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_remove(&handle->alc_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }

    // free all blocks in read list
    // linked list
    e = list_begin(&handle->read_list);
    while(e) {
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_remove(&handle->read_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }

#ifdef __BTREEBLK_BLOCKPOOL
    // free all blocks in the block pool
    struct btreeblk_addr *item;

    e = list_begin(&handle->blockpool);
    while(e){
        item = _get_entry(e, struct btreeblk_addr, le);
        e = list_next(e);

        free_align(item->addr);
        mempool_free(item);
    }
#endif

    uint32_t i;
    for (i=0;i<handle->nsb;++i){
        free(handle->sb[i].bitmap);
    }
    free(handle->sb);
}